

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Execute<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,
          ArgMinMaxState<double,_duckdb::string_t> *state,double x_data,string_t y_data,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ArgMinMaxBase<duckdb::LessThan,false> AVar4;
  string_t new_value;
  anon_union_16_2_67f50693_for_value local_30;
  double local_20;
  
  uVar2 = y_data.value._8_8_;
  local_30.pointer.ptr = (char *)y_data.value._0_8_;
  uVar3 = uVar2;
  if ((**(long **)(uVar2 + 0x10) != 0) &&
     (uVar3 = *(ulong *)(uVar2 + 0x20),
     (*(ulong *)(**(long **)(uVar2 + 0x10) + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) == 0)) {
    return;
  }
  local_30._0_8_ = state;
  local_20 = x_data;
  bVar1 = string_t::StringComparisonOperators::GreaterThan
                    ((string_t *)(this + 0x10),(string_t *)&local_30.pointer);
  if (!bVar1) {
    return;
  }
  if (**(long **)(uVar2 + 8) == 0) {
    this[1] = (ArgMinMaxBase<duckdb::LessThan,false>)0x0;
  }
  else {
    uVar3 = *(ulong *)(uVar2 + 0x18);
    AVar4 = (ArgMinMaxBase<duckdb::LessThan,false>)
            ((*(ulong *)(**(long **)(uVar2 + 8) + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) == 0);
    this[1] = AVar4;
    if ((bool)AVar4) goto LAB_019c9aa9;
  }
  *(double *)(this + 8) = local_20;
LAB_019c9aa9:
  new_value.value.pointer.ptr = (char *)uVar3;
  new_value.value._0_8_ = local_30.pointer.ptr;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)(this + 0x10),(string_t *)local_30._0_8_,new_value);
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}